

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowReturnOneRow(Parse *pParse,Window *pMWin,int regGosub,int addrGosub)

{
  byte bVar1;
  int p1;
  int p1_00;
  FuncDef *pFVar2;
  char *pcVar3;
  int *piVar4;
  uint uVar5;
  int p2;
  int iVar6;
  Vdbe *p;
  Window *pWVar7;
  
  p = sqlite3GetVdbe(pParse);
  pWVar7 = pMWin;
  do {
    if (pWVar7 == (Window *)0x0) {
      sqlite3VdbeAddOp2(p,0xc,regGosub,addrGosub);
      return;
    }
    pFVar2 = pWVar7->pFunc;
    pcVar3 = pFVar2->zName;
    if (pcVar3 == "nth_value" || pcVar3 == "first_value") {
      iVar6 = pWVar7->csrApp;
      uVar5 = sqlite3VdbeMakeLabel(p);
      p2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x49,0,pWVar7->regResult);
      if (pFVar2->zName == "nth_value") {
        sqlite3VdbeAddOp3(p,0x5a,pMWin->iEphCsr,pWVar7->iArgCol + 1,p2);
        windowCheckIntValue(pParse,p2,2);
      }
      else {
        sqlite3VdbeAddOp2(p,0x46,1,p2);
      }
      sqlite3VdbeAddOp3(p,0x60,p2,pWVar7->regApp,p2);
      sqlite3VdbeAddOp3(p,0x36,pWVar7->regApp + 1,uVar5,p2);
      sqlite3VdbeAddOp3(p,0x1e,iVar6,0,p2);
      sqlite3VdbeAddOp3(p,0x5a,iVar6,pWVar7->iArgCol,pWVar7->regResult);
      piVar4 = p->pParse->aLabel;
      if (piVar4 != (int *)0x0) {
        piVar4[(int)~uVar5] = p->nOp;
      }
      if (p2 != 0) {
        bVar1 = pParse->nTempReg;
joined_r0x001833f1:
        if (bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = p2;
        }
      }
    }
    else if (pcVar3 == "lead" || pcVar3 == "lag") {
      iVar6 = ((pWVar7->pOwner->x).pList)->nExpr;
      p1 = pMWin->iEphCsr;
      p1_00 = pWVar7->csrApp;
      uVar5 = sqlite3VdbeMakeLabel(p);
      p2 = sqlite3GetTempReg(pParse);
      if (iVar6 < 3) {
        sqlite3VdbeAddOp2(p,0x49,0,pWVar7->regResult);
      }
      else {
        sqlite3VdbeAddOp3(p,0x5a,p1,pWVar7->iArgCol + 2,pWVar7->regResult);
      }
      sqlite3VdbeAddOp2(p,0x81,p1,p2);
      pcVar3 = pFVar2->zName;
      if (iVar6 < 2) {
        sqlite3VdbeAddOp2(p,0x53,p2,((pcVar3 == "lead") - 1) + (uint)(pcVar3 == "lead"));
      }
      else {
        iVar6 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(p,0x5a,p1,pWVar7->iArgCol + 1,iVar6);
        sqlite3VdbeAddOp3(p,pcVar3 == "lead" ^ 0x61,iVar6,p2,p2);
        if (iVar6 != 0) {
          bVar1 = pParse->nTempReg;
          if ((ulong)bVar1 < 8) {
            pParse->nTempReg = bVar1 + 1;
            pParse->aTempReg[bVar1] = iVar6;
          }
        }
      }
      sqlite3VdbeAddOp3(p,0x1e,p1_00,uVar5,p2);
      sqlite3VdbeAddOp3(p,0x5a,p1_00,pWVar7->iArgCol,pWVar7->regResult);
      piVar4 = p->pParse->aLabel;
      if (piVar4 != (int *)0x0) {
        piVar4[(int)~uVar5] = p->nOp;
      }
      if (p2 != 0) {
        bVar1 = pParse->nTempReg;
        goto joined_r0x001833f1;
      }
    }
    pWVar7 = pWVar7->pNextWin;
  } while( true );
}

Assistant:

static void windowReturnOneRow(
  Parse *pParse,
  Window *pMWin,
  int regGosub,
  int addrGosub
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pFunc;
    if( pFunc->zName==nth_valueName
     || pFunc->zName==first_valueName
    ){
      int csr = pWin->csrApp;
      int lbl = sqlite3VdbeMakeLabel(v);
      int tmpReg = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);

      if( pFunc->zName==nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+1,tmpReg);
        windowCheckIntValue(pParse, tmpReg, 2);
      }else{
        sqlite3VdbeAddOp2(v, OP_Integer, 1, tmpReg);
      }
      sqlite3VdbeAddOp3(v, OP_Add, tmpReg, pWin->regApp, tmpReg);
      sqlite3VdbeAddOp3(v, OP_Gt, pWin->regApp+1, lbl, tmpReg);
      VdbeCoverageNeverNull(v);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, 0, tmpReg);
      VdbeCoverageNeverTaken(v);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
      sqlite3VdbeResolveLabel(v, lbl);
      sqlite3ReleaseTempReg(pParse, tmpReg);
    }
    else if( pFunc->zName==leadName || pFunc->zName==lagName ){
      int nArg = pWin->pOwner->x.pList->nExpr;
      int iEph = pMWin->iEphCsr;
      int csr = pWin->csrApp;
      int lbl = sqlite3VdbeMakeLabel(v);
      int tmpReg = sqlite3GetTempReg(pParse);

      if( nArg<3 ){
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+2, pWin->regResult);
      }
      sqlite3VdbeAddOp2(v, OP_Rowid, iEph, tmpReg);
      if( nArg<2 ){
        int val = (pFunc->zName==leadName ? 1 : -1);
        sqlite3VdbeAddOp2(v, OP_AddImm, tmpReg, val);
      }else{
        int op = (pFunc->zName==leadName ? OP_Add : OP_Subtract);
        int tmpReg2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_Column, iEph, pWin->iArgCol+1, tmpReg2);
        sqlite3VdbeAddOp3(v, op, tmpReg2, tmpReg, tmpReg);
        sqlite3ReleaseTempReg(pParse, tmpReg2);
      }

      sqlite3VdbeAddOp3(v, OP_SeekRowid, csr, lbl, tmpReg);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol, pWin->regResult);
      sqlite3VdbeResolveLabel(v, lbl);
      sqlite3ReleaseTempReg(pParse, tmpReg);
    }
  }
  sqlite3VdbeAddOp2(v, OP_Gosub, regGosub, addrGosub);
}